

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall Runtime::assignVar(Runtime *this,string *name,Data *data)

{
  reference ppVVar1;
  VarEnv *this_00;
  _Fwd_list_iterator<VarEnv_*> local_28;
  iterator cursor;
  Data *data_local;
  string *name_local;
  Runtime *this_local;
  
  cursor._M_node = (_Fwd_list_node_base *)data;
  local_28._M_node =
       (_Fwd_list_node_base *)
       std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::begin(&this->varEnvs);
  std::_Fwd_list_iterator<VarEnv_*>::operator++(&local_28,0);
  ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&local_28);
  if (*ppVVar1 == (VarEnv *)0x0) {
    this_00 = (VarEnv *)operator_new(0x30);
    VarEnv::VarEnv(this_00);
    ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&local_28);
    *ppVVar1 = this_00;
  }
  ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&local_28);
  VarEnv::assignVar(*ppVVar1,name,(Data *)cursor._M_node);
  return;
}

Assistant:

void Runtime::assignVar(std::string &name, Data *data) {
    auto cursor = varEnvs.begin();
    cursor++;
    if (*cursor == NULL) {
        *cursor = new VarEnv();
    }
    (*cursor)->assignVar(name, data);
}